

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_parser.c
# Opt level: O2

uint8_t * apx_signatureParser_parse_data_element
                    (apx_signatureParser_t *self,uint8_t *begin,uint8_t *end)

{
  apx_signatureParserState_t *paVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  apx_typeCode_t type_code;
  uint8_t uVar6;
  apx_error_t aVar7;
  uint8_t *puVar8;
  apx_dataElement_t *paVar9;
  uint8_t *puVar10;
  apx_signatureParserState_t *paVar11;
  uint8_t *puVar12;
  undefined4 uVar13;
  int64_t lower_limit;
  int64_t upper_limit;
  undefined4 local_34;
  undefined7 uVar14;
  
  if (self->state == (apx_signatureParserState_t *)0x0) {
    __assert_fail("(self != NULL) && (self->state != NULL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/signature_parser.c"
                  ,0xc5,
                  "const uint8_t *apx_signatureParser_parse_data_element(apx_signatureParser_t *, const uint8_t *, const uint8_t *)"
                 );
  }
  if (self->state->is_record == true) {
    puVar8 = bstr_match_pair(begin,end,'\"','\"','\\');
    if (begin < puVar8) {
      puVar10 = begin + 1;
      puVar12 = puVar8 + 1;
      goto LAB_00136036;
    }
    goto LAB_00136735;
  }
  puVar8 = (uint8_t *)0x0;
  puVar10 = (uint8_t *)0x0;
  puVar12 = begin;
LAB_00136036:
  if (end <= puVar12) {
    return begin;
  }
  uVar6 = *puVar12;
  uVar14 = (undefined7)((ulong)begin >> 8);
  uVar13 = (undefined4)CONCAT71(uVar14,1);
  switch(uVar6) {
  case 'Q':
    type_code = '\x04';
    bVar5 = true;
    uVar13 = 0;
    goto LAB_0013612d;
  case 'R':
  case 'V':
  case 'W':
  case 'X':
  case 'Y':
  case 'Z':
  case '\\':
  case ']':
  case '^':
  case '_':
  case '`':
    goto switchD_001360e5_caseD_6d;
  case 'S':
    type_code = '\x02';
    goto LAB_0013618e;
  case 'T':
    type_code = '\x10';
    uVar13 = (undefined4)CONCAT71(uVar14,1);
    bVar5 = false;
    bVar4 = false;
    bVar2 = true;
    goto LAB_001361de;
  case 'U':
    type_code = '\f';
    break;
  case '[':
switchD_001360bf_caseD_5b:
    self->error_code = 0xb;
    goto LAB_00136820;
  case 'a':
    type_code = '\t';
    break;
  case 'b':
    type_code = '\r';
    break;
  case 'c':
    type_code = '\x05';
    goto LAB_00136122;
  default:
    switch(uVar6) {
    case 'l':
      type_code = '\a';
      break;
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'r':
    case 't':
      goto switchD_001360e5_caseD_6d;
    case 'q':
      type_code = '\b';
      uVar13 = (undefined4)CONCAT71(uVar14,1);
      bVar2 = false;
      bVar5 = true;
      bVar4 = true;
      goto LAB_001361de;
    case 's':
      type_code = '\x06';
      break;
    case 'u':
      type_code = '\v';
      goto LAB_001361cb;
    default:
      if (uVar6 == '(') goto switchD_001360bf_caseD_5b;
      if (uVar6 == 'A') {
        type_code = '\n';
        goto LAB_001361cb;
      }
      if (uVar6 == 'B') {
        type_code = '\x0e';
LAB_0013618e:
        bVar4 = true;
        uVar13 = 0;
        bVar5 = false;
        goto LAB_001361db;
      }
      if (uVar6 == 'C') {
        bVar4 = true;
        uVar13 = 0;
        bVar5 = false;
        bVar2 = false;
        bVar3 = false;
        type_code = '\x01';
      }
      else {
        if (uVar6 == 'L') {
          type_code = '\x03';
          goto LAB_0013618e;
        }
        if (uVar6 != '{') goto switchD_001360e5_caseD_6d;
        type_code = '\x0f';
        bVar5 = false;
        bVar4 = false;
        bVar2 = false;
        bVar3 = true;
      }
      goto LAB_001361e6;
    }
LAB_00136122:
    uVar13 = (undefined4)CONCAT71(uVar14,1);
    bVar5 = false;
LAB_0013612d:
    bVar4 = true;
    goto LAB_001361db;
  }
LAB_001361cb:
  bVar5 = false;
  bVar4 = false;
LAB_001361db:
  bVar2 = false;
LAB_001361de:
  bVar3 = false;
LAB_001361e6:
  paVar9 = apx_dataElement_new(type_code);
  self->state->data_element = paVar9;
  if (paVar9 == (apx_dataElement_t *)0x0) {
    self->error_code = 2;
    goto LAB_00136820;
  }
  begin = puVar12 + 1;
  local_34 = uVar13;
  if (puVar10 != (uint8_t *)0x0) {
    if ((puVar8 == (uint8_t *)0x0) || (puVar8 < puVar10)) {
      __assert_fail("(name_end != NULL) && (name_begin <= name_end)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/signature_parser.c"
                    ,0x13b,
                    "const uint8_t *apx_signatureParser_parse_data_element(apx_signatureParser_t *, const uint8_t *, const uint8_t *)"
                   );
    }
    aVar7 = apx_dataElement_set_name_bstr(paVar9,puVar10,puVar8);
    if (aVar7 != 0) {
      self->error_code = aVar7;
      goto LAB_0013673c;
    }
  }
  if (bVar2) {
    if (((begin < end) && (*begin == '[')) && (puVar8 = bstr_lstrip(puVar12 + 2,end), puVar8 < end))
    {
      if (*puVar8 == '\"') {
        puVar10 = bstr_match_pair(puVar8,end,'\"','\"','\\');
        if ((puVar8 < puVar10) &&
           (aVar7 = apx_dataElement_set_type_ref_name_bstr
                              (self->state->data_element,puVar8 + 1,puVar10), aVar7 == 0)) {
          puVar10 = puVar10 + 1;
LAB_0013670c:
          puVar8 = bstr_lstrip(puVar10,end);
          if (puVar8 < end) {
            puVar12 = (uint8_t *)0x0;
            if (*puVar8 == ']') {
              puVar12 = puVar8 + 1;
            }
            if (begin < puVar12) goto LAB_0013636c;
          }
        }
      }
      else {
        puVar10 = apx_parserBase_parse_u32(puVar8,end,(uint32_t *)&lower_limit);
        if (puVar8 < puVar10) {
          apx_dataElement_set_type_ref_id(self->state->data_element,(uint32_t)lower_limit);
          goto LAB_0013670c;
        }
      }
    }
LAB_00136735:
    self->error_code = 3;
LAB_0013673c:
    self->error_pos = begin;
    return (uint8_t *)0x0;
  }
  puVar12 = begin;
  if (bVar3) {
    paVar1 = self->state;
    paVar11 = apx_signatureParserState_new(true);
    self->state = paVar11;
    do {
      if (end <= puVar12) goto LAB_0013636c;
      puVar8 = apx_signatureParser_parse_data_element(self,puVar12,end);
      if (puVar8 <= puVar12) {
        self->error_code = 3;
        self->error_pos = puVar12;
        paVar11 = self->state;
LAB_00136533:
        apx_signatureParserState_delete(paVar11);
        self->state = paVar1;
        return (uint8_t *)0x0;
      }
      if (paVar1->data_element == (apx_dataElement_t *)0x0) {
        __assert_fail("parent->data_element != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/signature_parser.c"
                      ,0x15b,
                      "const uint8_t *apx_signatureParser_parse_data_element(apx_signatureParser_t *, const uint8_t *, const uint8_t *)"
                     );
      }
      paVar9 = self->state->data_element;
      if (paVar9 == (apx_dataElement_t *)0x0) {
        __assert_fail("self->state->data_element != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/signature_parser.c"
                      ,0x15c,
                      "const uint8_t *apx_signatureParser_parse_data_element(apx_signatureParser_t *, const uint8_t *, const uint8_t *)"
                     );
      }
      apx_dataElement_append_child(paVar1->data_element,paVar9);
      paVar11 = self->state;
      paVar11->data_element = (apx_dataElement_t *)0x0;
      if (end <= puVar8) {
        self->error_code = 3;
        self->error_pos = puVar8;
        goto LAB_00136533;
      }
      puVar12 = puVar8;
    } while (*puVar8 != '}');
    apx_signatureParserState_delete(paVar11);
    self->state = paVar1;
    puVar12 = puVar8 + 1;
  }
LAB_0013636c:
  puVar8 = puVar12;
  if (!bVar4) goto LAB_00136761;
  puVar10 = puVar12;
  if (!bVar5) {
    if ((char)local_34 == '\0') {
      if (puVar12 < end) {
        if (*puVar12 == '(') {
          puVar8 = bstr_lstrip(puVar12 + 1,end);
          if (puVar8 < end) {
            puVar10 = apx_parserBase_parse_u32(puVar8,end,(uint32_t *)&lower_limit);
            if (puVar8 < puVar10) {
              puVar8 = bstr_lstrip(puVar10,end);
              if (((end <= puVar8) || (*puVar8 != ',')) ||
                 (puVar8 = bstr_lstrip(puVar8 + 1,end), end <= puVar8)) goto LAB_0013674d;
              puVar10 = apx_parserBase_parse_u32(puVar8,end,(uint32_t *)&upper_limit);
              if (puVar8 < puVar10) {
                apx_dataElement_set_limits_uint32
                          (self->state->data_element,(uint32_t)lower_limit,(uint32_t)upper_limit);
                goto LAB_001366bb;
              }
              goto LAB_00136845;
            }
            goto LAB_00136745;
          }
          goto switchD_001360e5_caseD_6d;
        }
        goto LAB_00136761;
      }
LAB_00136755:
      puVar8 = puVar12;
      if (puVar10 != (uint8_t *)0x0) goto LAB_00136761;
    }
    else {
      if (end <= puVar12) goto LAB_00136755;
      if (*puVar12 != '(') goto LAB_00136761;
      puVar8 = bstr_lstrip(puVar12 + 1,end);
      if (puVar8 < end) {
        puVar10 = apx_parserBase_parse_i32(puVar8,end,(int32_t *)&lower_limit);
        if (puVar8 < puVar10) {
          puVar8 = bstr_lstrip(puVar10,end);
          if (((end <= puVar8) || (*puVar8 != ',')) ||
             (puVar8 = bstr_lstrip(puVar8 + 1,end), end <= puVar8)) goto LAB_0013674d;
          puVar10 = apx_parserBase_parse_i32(puVar8,end,(int32_t *)&upper_limit);
          if (puVar8 < puVar10) {
            apx_dataElement_set_limits_int32
                      (self->state->data_element,(uint32_t)lower_limit,(uint32_t)upper_limit);
            goto LAB_001366bb;
          }
LAB_00136845:
          puVar10 = (uint8_t *)0x0;
          goto LAB_00136750;
        }
LAB_00136745:
        puVar10 = (uint8_t *)0x0;
        goto LAB_00136750;
      }
    }
switchD_001360e5_caseD_6d:
    self->error_code = 3;
LAB_00136820:
    self->error_pos = puVar12;
    return (uint8_t *)0x0;
  }
  if ((char)local_34 == '\0') {
    if (end <= puVar12) goto LAB_00136755;
    if (*puVar12 == '(') {
      puVar8 = bstr_lstrip(puVar12 + 1,end);
      if (end <= puVar8) goto switchD_001360e5_caseD_6d;
      puVar10 = apx_parserBase_parse_u64(puVar8,end,(uint64_t *)&lower_limit);
      if (puVar10 <= puVar8) goto LAB_00136745;
      puVar8 = bstr_lstrip(puVar10,end);
      if (((puVar8 < end) && (*puVar8 == ',')) &&
         (puVar8 = bstr_lstrip(puVar8 + 1,end), puVar8 < end)) {
        puVar10 = apx_parserBase_parse_u64(puVar8,end,(uint64_t *)&upper_limit);
        if (puVar8 < puVar10) {
          apx_dataElement_set_limits_uint64
                    (self->state->data_element,CONCAT44(lower_limit._4_4_,(uint32_t)lower_limit),
                     CONCAT44(upper_limit._4_4_,(uint32_t)upper_limit));
          goto LAB_001366bb;
        }
        goto LAB_00136845;
      }
LAB_0013674d:
      puVar10 = (uint8_t *)0x0;
LAB_00136750:
      puVar8 = puVar10;
      if (puVar10 <= puVar12) goto LAB_00136755;
    }
  }
  else {
    if (end <= puVar12) goto LAB_00136755;
    if (*puVar12 == '(') {
      puVar8 = bstr_lstrip(puVar12 + 1,end);
      if (puVar8 < end) {
        puVar10 = apx_parserBase_parse_i64(puVar8,end,&lower_limit);
        if (puVar8 < puVar10) {
          puVar8 = bstr_lstrip(puVar10,end);
          if (((end <= puVar8) || (*puVar8 != ',')) ||
             (puVar8 = bstr_lstrip(puVar8 + 1,end), end <= puVar8)) goto LAB_0013674d;
          puVar10 = apx_parserBase_parse_i64(puVar8,end,&upper_limit);
          if (puVar8 < puVar10) {
            apx_dataElement_set_limits_int64
                      (self->state->data_element,CONCAT44(lower_limit._4_4_,(uint32_t)lower_limit),
                       CONCAT44(upper_limit._4_4_,(uint32_t)upper_limit));
LAB_001366bb:
            puVar8 = bstr_lstrip(puVar10,end);
            if (puVar8 < end) {
              puVar10 = (uint8_t *)0x0;
              if (*puVar8 == ')') {
                puVar10 = puVar8 + 1;
              }
              goto LAB_00136750;
            }
          }
          goto LAB_00136845;
        }
        goto LAB_00136745;
      }
      goto switchD_001360e5_caseD_6d;
    }
  }
LAB_00136761:
  puVar10 = puVar8;
  if (puVar8 < end) {
    if (*puVar8 != '[') {
      return puVar8;
    }
    puVar10 = bstr_lstrip(puVar8 + 1,end);
    if ((end <= puVar10) ||
       (puVar12 = apx_parserBase_parse_u32(puVar10,end,(uint32_t *)&lower_limit), puVar12 <= puVar10
       )) goto LAB_00136838;
    apx_dataElement_set_array_length(self->state->data_element,(uint32_t)lower_limit);
    puVar12 = bstr_lstrip(puVar12,end);
    if (end <= puVar12) goto LAB_00136838;
    uVar6 = *puVar12;
    if (uVar6 == '*') {
      apx_dataElement_set_dynamic_array(self->state->data_element);
      puVar12 = bstr_lstrip(puVar12 + 1,end);
      if (end <= puVar12) goto LAB_00136838;
      uVar6 = *puVar12;
    }
    puVar10 = (uint8_t *)0x0;
    if (uVar6 == ']') {
      puVar10 = puVar12 + 1;
    }
    if (puVar8 < puVar10) {
      return puVar10;
    }
  }
  if (puVar10 != (uint8_t *)0x0) {
    return puVar8;
  }
LAB_00136838:
  self->error_code = 3;
  self->error_pos = puVar8;
  return (uint8_t *)0x0;
}

Assistant:

static uint8_t const* apx_signatureParser_parse_data_element(apx_signatureParser_t* self, uint8_t const* begin, uint8_t const* end)
{
   uint8_t const* next = begin;
   uint8_t const* name_begin = NULL;
   uint8_t const* name_end = NULL;
   uint8_t const* result = NULL;
   assert( (self != NULL) && (self->state != NULL) );

   if (self->state->is_record)
   {
      result = bstr_match_pair(next, end, '"', '"', '\\');
      if (result > next)
      {
         name_begin = next + 1; //Don't include first '"' character
         name_end = result;
         next = result + 1; //Move past second '"' character
      }
      else
      {
         apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
         return NULL;
      }
   }
   if (next >= end)
   {
      return begin;
   }
   const char c = *next;
   bool is_signed_type = true;
   bool is_64_bit_type = false;
   bool check_limits = true;
   apx_typeCode_t type_code = APX_TYPE_CODE_NONE;
   apx_tokenClass_t token_class = APX_TOKEN_CLASS_DATA_ELEMENT;
   switch (c)
   {
   case '{':
      type_code = APX_TYPE_CODE_RECORD;
      check_limits = false;
      break;
   case '[':
      token_class = APX_TOKEN_GROUP_DECLARATION;
      check_limits = false;
      break;
   case '(':
      token_class = APX_TOKEN_FUNCTION_DECLARATION;
      check_limits = false;
      break;
   case 'a':
      type_code = APX_TYPE_CODE_CHAR;
      check_limits = false;
      break;
   case 'A':
      type_code = APX_TYPE_CODE_CHAR8;
      check_limits = false;
      break;
   case 'b':
      type_code = APX_TYPE_CODE_BOOL;
      check_limits = false;
      break;
   case 'B':
      type_code = APX_TYPE_CODE_BYTE;
      is_signed_type = false;
      break;
   case 'c':
      type_code = APX_TYPE_CODE_INT8;
      break;
   case 'C':
      type_code = APX_TYPE_CODE_UINT8;
      is_signed_type = false;
      break;
   case 'l':
      type_code = APX_TYPE_CODE_INT32;
      break;
   case 'L':
      type_code = APX_TYPE_CODE_UINT32;
      is_signed_type = false;
      break;
   case 'q':
      type_code = APX_TYPE_CODE_INT64;
      is_64_bit_type = true;
      break;
   case 'Q':
      type_code = APX_TYPE_CODE_UINT64;
      is_signed_type = false;
      is_64_bit_type = true;
      break;
   case 's':
      type_code = APX_TYPE_CODE_INT16;
      break;
   case 'S':
      type_code = APX_TYPE_CODE_UINT16;
      is_signed_type = false;
      break;
   case 'T':
      type_code = APX_TYPE_CODE_REF_ID; //Initial guess, might change while parsing continues
      check_limits = false;
      break;
   case 'u':
      type_code = APX_TYPE_CODE_CHAR16;
      check_limits = false;
      break;
   case 'U':
      type_code = APX_TYPE_CODE_CHAR32;
      check_limits = false;
      break;
   }
   if (token_class == APX_TOKEN_CLASS_DATA_ELEMENT)
   {
      if (type_code == APX_TYPE_CODE_NONE)
      {
         apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
         return NULL;
      }
      else
      {
         self->state->data_element = apx_dataElement_new(type_code);
         if (self->state->data_element == NULL)
         {
            apx_signatureParser_set_error(self, APX_MEM_ERROR, next);
            return NULL;
         }
         next++;
         if (name_begin != NULL)
         {
            assert((name_end != NULL) && (name_begin <= name_end));
            apx_error_t rc = apx_dataElement_set_name_bstr(self->state->data_element, name_begin, name_end);
            if (rc != APX_NO_ERROR)
            {
               apx_signatureParser_set_error(self, rc, next);
               return NULL;
            }
         }
      }
      if (type_code == APX_TYPE_CODE_REF_ID)
      {
         result = apx_signatureParser_parse_type_reference(self, next, end);
         if (result > next)
         {
            next = result;
         }
         else
         {
            apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
            return NULL;
         }
      }
      else if (type_code == APX_TYPE_CODE_RECORD)
      {
         apx_signatureParserState_t* parent = self->state;
         self->state = apx_signatureParserState_new(true);
         while (next < end)
         {
            result = apx_signatureParser_parse_data_element(self, next, end);
            if (result > next)
            {
               next = result;
               assert(parent->data_element != NULL);
               assert(self->state->data_element != NULL);
               apx_dataElement_append_child(parent->data_element, self->state->data_element);
               self->state->data_element = NULL; //Move ownership to parent
            }
            else
            {
               apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
               apx_signatureParserState_delete(self->state);
               self->state = parent;
               return NULL;
            }
            if (next >= end)
            {
               apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
               apx_signatureParserState_delete(self->state);
               self->state = parent;
               return NULL;
            }
            if (*next == '}')
            {
               next++;
               apx_signatureParserState_delete(self->state);
               self->state = parent;
               break;
            }
         }
      }
      if (check_limits)
      {
         if (is_64_bit_type)
         {
            result = is_signed_type ? apx_signatureParser_parse_limits_i64(self, next, end) : apx_signatureParser_parse_limits_u64(self, next, end);
         }
         else
         {
            result = is_signed_type ? apx_signatureParser_parse_limits_i32(self, next, end) : apx_signatureParser_parse_limits_u32(self, next, end);
         }
         if (result > next)
         {
            next = result;
         }
         else if (result == NULL)
         {
            apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
            return NULL;
         }
      }
      result = apx_signatureParser_parse_array(self, next, end);
      if (result > next)
      {
         next = result;
      }
      else if (result == NULL)
      {
         apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
         return NULL;
      }
   }
   else
   {
      apx_signatureParser_set_error(self, APX_NOT_IMPLEMENTED_ERROR, next);
      return NULL;
   }
   return next;
}